

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t helper_stqcx_be_parallel
                   (CPUPPCState_conflict2 *env,target_ulong addr,uint64_t new_lo,uint64_t new_hi,
                   uint32_t opidx)

{
  target_ulong tVar1;
  Int128 *addr_00;
  undefined1 cmpv [16];
  undefined1 newv [16];
  uint uVar2;
  Int128 *pIVar3;
  target_ulong extraout_RDX;
  undefined8 unaff_RBX;
  undefined8 unaff_R14;
  undefined8 unaff_retaddr;
  
  if (env->reserve_addr == addr) {
    cmpv._4_4_ = 0;
    cmpv._0_4_ = opidx;
    tVar1 = env->reserve_val;
    addr_00 = (Int128 *)env->reserve_val2;
    cmpv._8_8_ = unaff_retaddr;
    newv._8_8_ = unaff_R14;
    newv._0_8_ = unaff_RBX;
    pIVar3 = helper_atomic_cmpxchgo_be_mmu_ppc64
                       ((Int128 *)env,(CPUArchState_conflict23 *)addr,(target_ulong)addr_00,
                        (Int128)cmpv,(Int128)newv,(TCGMemOpIdx)tVar1,new_lo);
    uVar2 = (uint)(pIVar3 == addr_00 && extraout_RDX == tVar1);
  }
  else {
    uVar2 = 0;
  }
  env->reserve_addr = 0xffffffffffffffff;
  return uVar2 + (int)env->so;
}

Assistant:

uint32_t helper_stqcx_be_parallel(CPUPPCState *env, target_ulong addr,
                                  uint64_t new_lo, uint64_t new_hi,
                                  uint32_t opidx)
{
    bool success = false;

    /* We will have raised EXCP_ATOMIC from the translator.  */
    assert(HAVE_CMPXCHG128);

    if (likely(addr == env->reserve_addr)) {
        Int128 oldv, cmpv, newv;

        cmpv = int128_make128(env->reserve_val2, env->reserve_val);
        newv = int128_make128(new_lo, new_hi);
        oldv = helper_atomic_cmpxchgo_be_mmu(env, addr, cmpv, newv,
                                             opidx, GETPC());
        success = int128_eq(oldv, cmpv);
    }
    env->reserve_addr = -1;
    return env->so + success * CRF_EQ_BIT;
}